

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.hpp
# Opt level: O2

bool __thiscall Cube::intersect(Cube *this,Ray *ray,Hit *result)

{
  float fVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  float fVar8;
  float t;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  point pVar18;
  
  uVar3._0_4_ = (ray->dir).x;
  uVar3._4_4_ = (ray->dir).y;
  uVar6 = -(uint)(0.0 < (float)(undefined4)uVar3);
  uVar7 = -(uint)(0.0 < (float)uVar3._4_4_);
  uVar2 = (ray->origin).x;
  uVar4 = (ray->origin).y;
  auVar10._0_4_ = (float)(~uVar6 & 0x3f000000 | uVar6 & 0xbf000000) - (float)uVar2;
  auVar10._4_4_ = (float)(~uVar7 & 0x3f000000 | uVar7 & 0xbf000000) - (float)uVar4;
  auVar10._8_8_ = 0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar3;
  auVar11 = divps(auVar10,auVar11);
  fVar9 = auVar11._0_4_;
  t = auVar11._4_4_;
  fVar16 = 1.0;
  fVar15 = (float)(~-(uint)(fVar9 < t) & 0x3f800000);
  if (t <= fVar9) {
    fVar16 = 0.0;
    t = fVar9;
  }
  auVar12._0_4_ = (float)(uVar6 & 0x3f000000 | ~uVar6 & 0xbf000000) - (float)uVar2;
  auVar12._4_4_ = (float)(uVar7 & 0x3f000000 | ~uVar7 & 0xbf000000) - (float)uVar4;
  auVar12._8_8_ = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar3;
  auVar11 = divps(auVar12,auVar5);
  fVar9 = auVar11._4_4_;
  if (auVar11._0_4_ <= auVar11._4_4_) {
    fVar9 = auVar11._0_4_;
  }
  fVar14 = (ray->dir).z;
  fVar1 = (ray->origin).z;
  if (fVar14 <= 0.0) {
    fVar8 = 0.5 - fVar1;
    fVar13 = -0.5;
  }
  else {
    fVar8 = -0.5 - fVar1;
    fVar13 = 0.5;
  }
  fVar17 = 0.0;
  if (t < fVar8 / fVar14) {
    fVar17 = 1.0;
    fVar15 = 0.0;
    fVar16 = 0.0;
    t = fVar8 / fVar14;
  }
  fVar14 = (fVar13 - fVar1) / fVar14;
  if (fVar9 <= fVar14) {
    fVar14 = fVar9;
  }
  if (t <= fVar14 && 0.0 < t) {
    pVar18 = Ray::atParam(ray,t);
    result->hit = true;
    (result->p).x = (float)(int)pVar18._0_8_;
    (result->p).y = (float)(int)((ulong)pVar18._0_8_ >> 0x20);
    (result->p).z = pVar18.z;
    (result->Ns).x = fVar15;
    (result->Ns).y = fVar16;
    (result->Ns).z = fVar17;
    (result->Ng).x = fVar15;
    (result->Ng).y = fVar16;
    (result->Ng).z = fVar17;
    (result->uv).x = 0.0;
    (result->uv).y = 0.0;
    (result->dpdu).x = 0.0;
    (result->dpdu).y = 0.0;
    *(undefined8 *)&(result->dpdu).z = 0;
    (result->dpdv).y = 0.0;
    (result->dpdv).z = 0.0;
  }
  return t <= fVar14 && 0.0 < t;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		float tmin, tmax;
		vec3f resN = vec3f(1,0,0);

		if (ray.dir.x > 0) {
			tmin = (x1 - ray.origin.x) / ray.dir.x;
			tmax = (x2 - ray.origin.x) / ray.dir.x;
		}
		else {
			tmin = (x2 - ray.origin.x) / ray.dir.x;
			tmax = (x1 - ray.origin.x) / ray.dir.x;
		}
		if (ray.dir.y > 0) {
			float tminy = (y1 - ray.origin.y) / ray.dir.y;
			if (tminy > tmin) {
				tmin = tminy;
				resN = vec3f(0,1,0);
			}
			tmax = std::min(tmax, (y2 - ray.origin.y) / ray.dir.y);
		}
		else {
			float tminy = (y2 - ray.origin.y) / ray.dir.y;
			if (tminy > tmin) {
				tmin = tminy;
				resN = vec3f(0,1,0);
			}
			tmax = std::min(tmax, (y1 - ray.origin.y) / ray.dir.y);
		}
		if (ray.dir.z > 0) {
			float tminz = (z1 - ray.origin.z) / ray.dir.z;
			if (tminz > tmin) {
				tmin = tminz;
				resN = vec3f(0,0,1);
			}
			tmax = std::min(tmax, (z2 - ray.origin.z) / ray.dir.z);
		}
		else {
			float tminz = (z2 - ray.origin.z) / ray.dir.z;
			if (tminz > tmin) {
				tmin = tminz;
				resN = vec3f(0,0,1);
			}
			tmax = std::min(tmax, (z1 - ray.origin.z) / ray.dir.z);
		}
		if (0<tmin && tmin <= tmax)
		{
			*result = Hit(ray.atParam(tmin), resN, resN, 0); // TODO Cube texture
			return true;
		}
		return false;
	}